

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

float __thiscall Imath_2_5::Matrix44<float>::determinant(Matrix44<float> *this)

{
  float fVar1;
  Matrix44<float> *in_RDI;
  float fVar2;
  float sum;
  float local_c;
  
  local_c = 0.0;
  fVar1 = in_RDI->x[0][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = in_RDI->x[0][3];
    fVar2 = fastMinor(in_RDI,1,2,3,0,1,2);
    local_c = -fVar1 * fVar2 + 0.0;
  }
  fVar1 = in_RDI->x[1][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = in_RDI->x[1][3];
    fVar2 = fastMinor(in_RDI,0,2,3,0,1,2);
    local_c = fVar1 * fVar2 + local_c;
  }
  fVar1 = in_RDI->x[2][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = in_RDI->x[2][3];
    fVar2 = fastMinor(in_RDI,0,1,3,0,1,2);
    local_c = -fVar1 * fVar2 + local_c;
  }
  fVar1 = in_RDI->x[3][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar1 = in_RDI->x[3][3];
    fVar2 = fastMinor(in_RDI,0,1,2,0,1,2);
    local_c = fVar1 * fVar2 + local_c;
  }
  return local_c;
}

Assistant:

inline T
Matrix44<T>::determinant () const
{
    T sum = (T)0;

    if (x[0][3] != 0.) sum -= x[0][3] * fastMinor(1,2,3,0,1,2);
    if (x[1][3] != 0.) sum += x[1][3] * fastMinor(0,2,3,0,1,2);
    if (x[2][3] != 0.) sum -= x[2][3] * fastMinor(0,1,3,0,1,2);
    if (x[3][3] != 0.) sum += x[3][3] * fastMinor(0,1,2,0,1,2);

    return sum;
}